

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

bool slang::ast::Lookup::withinClassRandomize
               (ASTContext *context,NameSyntax *syntax,bitmask<slang::ast::LookupFlags> flags,
               LookupResult *result)

{
  int iVar1;
  RandomizeDetails *pRVar2;
  Scope *pSVar3;
  optional<slang::SourceRange> range;
  NameComponents name_00;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  bool bVar4;
  optional<bool> oVar5;
  LookupResult *name_01;
  Symbol *symbol;
  Scope *pSVar6;
  borrowed_iterator_t<const_std::span<const_std::basic_string_view<char>_>_&> bVar7;
  pointer pNVar8;
  LookupResult *scope;
  LookupResult *in_R9;
  _Storage<slang::SourceRange,_true> _Var9;
  string_view name_02;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  int colonParts;
  NameComponents name;
  anon_class_16_2_84665f96 findSuperScope;
  undefined7 uStack_1a7;
  ASTContext local_1a0;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  
  colonParts = 0;
  nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_ =
       (pointer)nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.
                firstElement;
  nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len = 0;
  nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.cap = 4;
  name_01 = (LookupResult *)syntax;
  if ((syntax->super_ExpressionSyntax).super_SyntaxNode.kind == ScopedName) {
    name_01 = (LookupResult *)
              anon_unknown_39::splitScopedName
                        ((ScopedNameSyntax *)syntax,
                         &nameParts.
                          super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>,
                         &colonParts);
  }
  pRVar2 = context->randomizeDetails;
  pSVar3 = pRVar2->classType;
  scope = name_01;
  findSuperScope.details = pRVar2;
  findSuperScope.context = context;
  anon_unknown_39::NameComponents::NameComponents(&name,(NameSyntax *)name_01);
  iVar1 = *(int *)&name_01->found;
  if ((iVar1 - 0xe5U < 2) || (iVar1 == 0x4b)) {
    scope = (LookupResult *)name.text._M_len;
    if (name.text._M_len != 0) {
      if ((pRVar2->nameRestrictions)._M_extent._M_extent_value != 0) {
        scope = (LookupResult *)&pRVar2->nameRestrictions;
        bVar7 = std::ranges::__find_fn::
                operator()<const_std::span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>_&,_std::basic_string_view<char,_std::char_traits<char>_>,_std::identity>
                          ((__find_fn *)&std::ranges::find,scope,&name);
        if (bVar7._M_current ==
            (pRVar2->nameRestrictions)._M_ptr + (pRVar2->nameRestrictions)._M_extent._M_extent_value
           ) goto LAB_0021a573;
      }
      name_02._M_str = name.text._M_str;
      name_02._M_len = name.text._M_len;
      scope = (LookupResult *)name.text._M_len;
      symbol = Scope::find(pSVar3,name_02);
      result->found = symbol;
      goto LAB_0021a456;
    }
  }
  else {
    if (iVar1 == 0x1c5) {
      pSVar6 = withinClassRandomize::anon_class_16_2_84665f96::operator()(&findSuperScope);
      scope = (LookupResult *)(ulong)flags.m_bits;
      range_02.endLoc = (SourceLocation)result;
      range_02.startLoc = name.range.endLoc;
      symbol = anon_unknown_39::findSuperHandle
                         ((anon_unknown_39 *)pSVar6,(Scope *)scope,
                          (bitmask<slang::ast::LookupFlags>)name.range.startLoc._0_4_,range_02,in_R9
                         );
LAB_0021a44b:
      result->found = symbol;
      colonParts = 1;
LAB_0021a456:
      if (symbol == (Symbol *)0x0) goto LAB_0021a573;
    }
    else {
      if (iVar1 != 0x1cc) goto LAB_0021a573;
      symbol = pRVar2->thisVar;
      result->found = symbol;
      if (symbol == (Symbol *)0x0) {
        scope = (LookupResult *)(ulong)flags.m_bits;
        range_00.endLoc = (SourceLocation)result;
        range_00.startLoc = name.range.endLoc;
        symbol = anon_unknown_39::findThisHandle
                           ((anon_unknown_39 *)(context->scope).ptr,(Scope *)scope,
                            (bitmask<slang::ast::LookupFlags>)name.range.startLoc._0_4_,range_00,
                            in_R9);
        result->found = symbol;
        if (symbol == (Symbol *)0x0) goto LAB_0021a573;
      }
      scope = (LookupResult *)
              (nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len *
              0x48);
      if ((nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_ +
          -1)[nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len].
          kind == SuperHandle) {
        pNVar8 = nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.
                 data_ + nameParts.
                         super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len;
        name.paramAssignments = pNVar8[-1].name.paramAssignments;
        name.text._M_len = pNVar8[-1].name.text._M_len;
        name.text._M_str = pNVar8[-1].name.text._M_str;
        name.range.startLoc = pNVar8[-1].name.range.startLoc;
        name.range.endLoc = pNVar8[-1].name.range.endLoc;
        name.selectors._M_ptr = pNVar8[-1].name.selectors._M_ptr;
        name.selectors._M_extent._M_extent_value =
             pNVar8[-1].name.selectors._M_extent._M_extent_value;
        nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len =
             nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len - 1
        ;
        pSVar6 = withinClassRandomize::anon_class_16_2_84665f96::operator()(&findSuperScope);
        scope = (LookupResult *)(ulong)flags.m_bits;
        range_01.endLoc = (SourceLocation)result;
        range_01.startLoc = name.range.endLoc;
        symbol = anon_unknown_39::findSuperHandle
                           ((anon_unknown_39 *)pSVar6,(Scope *)scope,
                            (bitmask<slang::ast::LookupFlags>)name.range.startLoc._0_4_,range_01,
                            in_R9);
        goto LAB_0021a44b;
      }
    }
    iVar1 = colonParts;
    local_1a0.lookupIndex = 0xffffffff;
    local_1a0.assertionInstance = (AssertionInstanceDetails *)0x0;
    local_1a0.flags.m_bits = 0;
    local_1a0.instanceOrProc = (Symbol *)0x0;
    local_1a0.firstTempVar = (TempVarSymbol *)0x0;
    local_1a0.randomizeDetails = (RandomizeDetails *)0x0;
    local_1a0.scope.ptr = pSVar3;
    if (colonParts == 0) {
      nameParts_00._M_extent._M_extent_value =
           nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len;
      nameParts_00._M_ptr =
           nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.data_;
      name_00.text._M_str = name.text._M_str;
      name_00.text._M_len = name.text._M_len;
      name_00.range.startLoc = name.range.startLoc;
      name_00.range.endLoc = name.range.endLoc;
      name_00.selectors._M_ptr = name.selectors._M_ptr;
      name_00.selectors._M_extent._M_extent_value = name.selectors._M_extent._M_extent_value;
      name_00.paramAssignments = name.paramAssignments;
      scope = (LookupResult *)
              nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>.len;
      bVar4 = anon_unknown_39::lookupDownward(nameParts_00,name_00,&local_1a0,flags,result);
    }
    else {
      oVar5 = anon_unknown_39::isClassType(symbol);
      if ((((ushort)oVar5.super__Optional_base<bool,_true,_true>._M_payload.
                    super__Optional_payload_base<bool> >> 8 & 1) == 0) ||
         (((ushort)oVar5.super__Optional_base<bool,_true,_true>._M_payload.
                   super__Optional_payload_base<bool> & 1) == 0)) goto LAB_0021a573;
      scope = (LookupResult *)(ulong)(uint)iVar1;
      bVar4 = anon_unknown_39::resolveColonNames
                        (&nameParts.
                          super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>,
                         iVar1,&name,flags,result,&local_1a0);
    }
    if (bVar4 != false) {
      pSVar3 = (context->scope).ptr;
      _Var9._M_value = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      bVar4 = true;
      range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_1a7;
      range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged = true;
      range.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value = _Var9._M_value;
      anon_unknown_39::unwrapResult(pSVar3,range,result,true);
      scope = result;
      goto LAB_0021a575;
    }
  }
LAB_0021a573:
  bVar4 = false;
LAB_0021a575:
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>::cleanup
            (&nameParts.super_SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>,
             (EVP_PKEY_CTX *)scope);
  return bVar4;
}

Assistant:

bool Lookup::withinClassRandomize(const ASTContext& context, const NameSyntax& syntax,
                                  bitmask<LookupFlags> flags, LookupResult& result) {
    int colonParts = 0;
    SmallVector<NamePlusLoc, 4> nameParts;
    const NameSyntax* first = &syntax;
    if (syntax.kind == SyntaxKind::ScopedName)
        first = splitScopedName(syntax.as<ScopedNameSyntax>(), nameParts, colonParts);

    SLANG_ASSERT(context.randomizeDetails);
    auto& details = *context.randomizeDetails;
    auto& classScope = *details.classType;

    auto findSuperScope = [&]() -> const Scope& {
        if (details.thisVar) {
            auto dt = details.thisVar->getDeclaredType();
            SLANG_ASSERT(dt);
            return dt->getType().getCanonicalType().as<ClassType>();
        }

        return *context.scope;
    };

    NameComponents name = *first;
    switch (first->kind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            if (name.text.empty())
                return false;

            // If the nameRestrictions list is not empty, we have to verify that the
            // first element is in the list. Otherwise, an empty list indicates that
            // the lookup is unrestricted.
            if (!details.nameRestrictions.empty()) {
                if (std::ranges::find(details.nameRestrictions, name.text) ==
                    details.nameRestrictions.end()) {
                    return false;
                }
            }

            result.found = classScope.find(name.text);
            break;
        case SyntaxKind::ThisHandle:
            result.found = details.thisVar;
            if (!result.found)
                result.found = findThisHandle(*context.scope, flags, name.range, result);

            if (result.found && nameParts.back().kind == SyntaxKind::SuperHandle) {
                // Handle "this.super.whatever" the same as if the user had just
                // written "super.whatever".
                name = nameParts.back().name;
                nameParts.pop_back();
                result.found = findSuperHandle(findSuperScope(), flags, name.range, result);
                colonParts = 1;
            }
            break;
        case SyntaxKind::SuperHandle:
            result.found = findSuperHandle(findSuperScope(), flags, name.range, result);
            colonParts = 1; // pretend we used colon access to resolve class scoped name
            break;
        default:
            // Return not found; the caller should do a normal lookup
            // to handle any of these other cases.
            return false;
    }

    if (!result.found)
        return false;

    ASTContext classContext(classScope, LookupLocation::max);
    if (colonParts) {
        // Disallow package lookups in this function.
        auto isClass = isClassType(*result.found);
        if (!isClass.has_value() || !isClass.value())
            return false;

        if (!resolveColonNames(nameParts, colonParts, name, flags, result, classContext))
            return false;
    }
    else {
        if (!lookupDownward(nameParts, name, classContext, flags, result))
            return false;
    }

    unwrapResult(*context.scope, syntax.sourceRange(), result);
    return true;
}